

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

void __thiscall proto2_unittest::TestOneof2::clear_foo_message(TestOneof2 *this)

{
  long *plVar1;
  FooCase FVar2;
  Arena *pAVar3;
  TestOneof2 *this_local;
  
  FVar2 = foo_case(this);
  if (FVar2 == kFooMessage) {
    pAVar3 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    if (pAVar3 == (Arena *)0x0) {
      plVar1 = *(long **)((long)&this->field_0 + 0x18);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    else {
      google::protobuf::internal::MaybePoisonAfterClear((this->field_0)._impl_.foo_.foo_message_);
    }
    clear_has_foo(this);
  }
  return;
}

Assistant:

inline void TestOneof2::clear_foo_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (foo_case() == kFooMessage) {
    if (GetArena() == nullptr) {
      delete _impl_.foo_.foo_message_;
    } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
      ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.foo_.foo_message_);
    }
    clear_has_foo();
  }
}